

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.cpp
# Opt level: O2

path * wallet::GetWalletDir(void)

{
  bool bVar1;
  path *in_RDI;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff38;
  path local_98;
  undefined1 local_68 [32];
  path local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(in_RDI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_68 + 0x20),"-walletdir",(allocator<char> *)&local_98);
  bVar1 = ArgsManager::IsArgSet(&gArgs,(string *)(local_68 + 0x20));
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"-walletdir",(allocator<char> *)&stack0xffffffffffffff3f);
    local_98._M_pathname.field_2._M_allocated_capacity = 0;
    local_98._M_pathname.field_2._8_8_ = 0;
    local_98._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_98._M_pathname._M_string_length = 0;
    local_98._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    std::filesystem::__cxx11::path::path(&local_98);
    ArgsManager::GetPathArg
              ((path *)(local_68 + 0x20),&gArgs,in_stack_ffffffffffffff38,(path *)local_68);
    std::filesystem::__cxx11::path::operator=(in_RDI,(path *)(local_68 + 0x20));
    std::filesystem::__cxx11::path::~path((path *)(local_68 + 0x20));
    std::filesystem::__cxx11::path::~path(&local_98);
    std::__cxx11::string::~string((string *)local_68);
    bVar1 = std::filesystem::is_directory(in_RDI);
    if (!bVar1) {
      fs::path::operator=((path *)in_RDI,"");
    }
  }
  else {
    ArgsManager::GetDataDirNet((path *)(local_68 + 0x20),&gArgs);
    std::filesystem::__cxx11::path::operator=(in_RDI,(path *)(local_68 + 0x20));
    std::filesystem::__cxx11::path::~path((path *)(local_68 + 0x20));
    std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff40,in_RDI);
    fs::path::operator/=((path *)&stack0xffffffffffffff40,"wallets");
    std::filesystem::__cxx11::path::path((path *)(local_68 + 0x20),(path *)&stack0xffffffffffffff40)
    ;
    bVar1 = std::filesystem::is_directory((path *)(local_68 + 0x20));
    std::filesystem::__cxx11::path::~path((path *)(local_68 + 0x20));
    std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff40);
    if (bVar1) {
      fs::path::operator/=((path *)in_RDI,"wallets");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

fs::path GetWalletDir()
{
    fs::path path;

    if (gArgs.IsArgSet("-walletdir")) {
        path = gArgs.GetPathArg("-walletdir");
        if (!fs::is_directory(path)) {
            // If the path specified doesn't exist, we return the deliberately
            // invalid empty string.
            path = "";
        }
    } else {
        path = gArgs.GetDataDirNet();
        // If a wallets directory exists, use that, otherwise default to GetDataDir
        if (fs::is_directory(path / "wallets")) {
            path /= "wallets";
        }
    }

    return path;
}